

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O3

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateCropLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *this_00;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  uint uVar4;
  pointer pcVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  bool bVar9;
  Type *pTVar10;
  iterator iVar11;
  mapped_type *pmVar12;
  undefined1 *puVar13;
  long *plVar14;
  undefined8 *puVar15;
  uint uVar16;
  ulong *puVar17;
  ulong uVar18;
  Result *_result;
  undefined8 uVar19;
  uint uVar20;
  _Rb_tree_header *p_Var21;
  string err;
  string local_f0;
  long *local_d0;
  undefined8 local_c8;
  long local_c0;
  undefined8 uStack_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  ulong *local_90;
  long local_88;
  ulong local_80 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  validateInputCount(__return_storage_ptr__,layer,1,2);
  bVar9 = Result::good(__return_storage_ptr__);
  if (!bVar9) {
    return __return_storage_ptr__;
  }
  pcVar5 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
  paVar1 = &(__return_storage_ptr__->m_message).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  validateOutputCount(__return_storage_ptr__,layer,1,1);
  bVar9 = Result::good(__return_storage_ptr__);
  if (!bVar9) {
    return __return_storage_ptr__;
  }
  pcVar5 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  if (this->ndArrayInterpretation == true) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Crop","");
    this_00 = &this->blobNameToRank;
    validateInputOutputRankEquality(__return_storage_ptr__,layer,&local_50,this_00);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    bVar9 = Result::good(__return_storage_ptr__);
    if (!bVar9) {
      return __return_storage_ptr__;
    }
    pcVar5 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar5 != paVar1) {
      operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
    }
    paVar2 = &local_f0.field_2;
    local_f0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"Crop","");
    validateRankCount(__return_storage_ptr__,layer,&local_f0,3,-1,this_00);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != paVar2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    bVar9 = Result::good(__return_storage_ptr__);
    if (!bVar9) {
      return __return_storage_ptr__;
    }
    pcVar5 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar5 != paVar1) {
      operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
    }
    if (1 < (layer->input_).super_RepeatedPtrFieldBase.current_size_) {
      this_01 = &layer->input_;
      pTVar10 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                          (&this_01->super_RepeatedPtrFieldBase,0);
      iVar11 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::find(&this_00->_M_t,pTVar10);
      p_Var21 = &(this->blobNameToRank)._M_t._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)iVar11._M_node != p_Var21) {
        pTVar10 = google::protobuf::internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                            (&this_01->super_RepeatedPtrFieldBase,1);
        iVar11 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::find(&this_00->_M_t,pTVar10);
        if ((_Rb_tree_header *)iVar11._M_node != p_Var21) {
          pTVar10 = google::protobuf::internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                              (&this_01->super_RepeatedPtrFieldBase,0);
          pmVar12 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    ::at(this_00,pTVar10);
          iVar3 = *pmVar12;
          pTVar10 = google::protobuf::internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                              (&this_01->super_RepeatedPtrFieldBase,1);
          pmVar12 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    ::at(this_00,pTVar10);
          if (iVar3 != *pmVar12) {
            local_f0._M_string_length = 0;
            local_f0.field_2._M_allocated_capacity =
                 local_f0.field_2._M_allocated_capacity & 0xffffffffffffff00;
            plVar14 = (long *)((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
            lVar6 = *plVar14;
            local_f0._M_dataplus._M_p = (pointer)paVar2;
            local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
            std::__cxx11::string::_M_construct<char*>((string *)&local_70,lVar6,plVar14[1] + lVar6);
            std::operator+(&local_b0,"Layer \'",&local_70);
            puVar15 = (undefined8 *)std::__cxx11::string::append((char *)&local_b0);
            plVar14 = puVar15 + 2;
            if ((long *)*puVar15 == plVar14) {
              local_c0 = *plVar14;
              uStack_b8 = puVar15[3];
              local_d0 = &local_c0;
            }
            else {
              local_c0 = *plVar14;
              local_d0 = (long *)*puVar15;
            }
            local_c8 = puVar15[1];
            *puVar15 = plVar14;
            puVar15[1] = 0;
            *(undefined1 *)(puVar15 + 2) = 0;
            std::__cxx11::string::operator=((string *)&local_f0,(string *)&local_d0);
            if (local_d0 != &local_c0) {
              operator_delete(local_d0,local_c0 + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
              operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
            }
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_f0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f0._M_dataplus._M_p == paVar2) {
              return __return_storage_ptr__;
            }
            goto LAB_00345655;
          }
        }
      }
    }
  }
  if (layer->_oneof_case_[0] == 0xbe) {
    puVar13 = *(undefined1 **)&layer->layer_;
  }
  else {
    puVar13 = Specification::_CropLayerParams_default_instance_;
  }
  if ((layer->input_).super_RepeatedPtrFieldBase.current_size_ == 1) {
    puVar13 = (undefined1 *)((BatchnormLayerParams *)puVar13)->variance_;
    if ((WeightParams *)puVar13 == (WeightParams *)0x0) {
      puVar13 = Specification::_BorderAmounts_default_instance_;
    }
    if (*(int *)&(((WeightParams *)puVar13)->floatvalue_).arena_or_elements_ == 2) {
LAB_0034511f:
      Result::Result(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    std::operator+(&local_70,"cropAmounts parameter for the crop layer \'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
    plVar14 = (long *)std::__cxx11::string::append((char *)&local_70);
    paVar1 = &local_b0.field_2;
    puVar17 = (ulong *)(plVar14 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar14 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar17) {
      local_b0.field_2._M_allocated_capacity = *puVar17;
      local_b0.field_2._8_8_ = plVar14[3];
      local_b0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_b0.field_2._M_allocated_capacity = *puVar17;
      local_b0._M_dataplus._M_p = (pointer)*plVar14;
    }
    local_b0._M_string_length = plVar14[1];
    *plVar14 = (long)puVar17;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    if (layer->_oneof_case_[0] == 0xbe) {
      puVar13 = *(undefined1 **)&layer->layer_;
    }
    else {
      puVar13 = Specification::_CropLayerParams_default_instance_;
    }
    puVar13 = (undefined1 *)((BatchnormLayerParams *)puVar13)->variance_;
    if ((WeightParams *)puVar13 == (WeightParams *)0x0) {
      puVar13 = Specification::_BorderAmounts_default_instance_;
    }
    uVar4 = *(uint *)&(((WeightParams *)puVar13)->floatvalue_).arena_or_elements_;
    uVar7 = -uVar4;
    if (0 < (int)uVar4) {
      uVar7 = uVar4;
    }
    uVar20 = 1;
    if (9 < uVar7) {
      uVar18 = (ulong)uVar7;
      uVar8 = 4;
      do {
        uVar20 = uVar8;
        uVar16 = (uint)uVar18;
        if (uVar16 < 100) {
          uVar20 = uVar20 - 2;
          goto LAB_003452f7;
        }
        if (uVar16 < 1000) {
          uVar20 = uVar20 - 1;
          goto LAB_003452f7;
        }
        if (uVar16 < 10000) goto LAB_003452f7;
        uVar18 = uVar18 / 10000;
        uVar8 = uVar20 + 4;
      } while (99999 < uVar16);
      uVar20 = uVar20 + 1;
    }
LAB_003452f7:
    local_90 = local_80;
    std::__cxx11::string::_M_construct((ulong)&local_90,(char)uVar20 - (char)((int)uVar4 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((ulong)(uVar4 >> 0x1f) + (long)local_90),uVar20,uVar7);
    uVar19 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar1) {
      uVar19 = local_b0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar19 < local_88 + local_b0._M_string_length) {
      uVar18 = 0xf;
      if (local_90 != local_80) {
        uVar18 = local_80[0];
      }
      if (uVar18 < local_88 + local_b0._M_string_length) goto LAB_00345369;
      puVar15 = (undefined8 *)
                std::__cxx11::string::replace
                          ((ulong)&local_90,0,(char *)0x0,(ulong)local_b0._M_dataplus._M_p);
    }
    else {
LAB_00345369:
      puVar15 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_90);
    }
    local_d0 = &local_c0;
    plVar14 = puVar15 + 2;
    if ((long *)*puVar15 == plVar14) {
      local_c0 = *plVar14;
      uStack_b8 = puVar15[3];
    }
    else {
      local_c0 = *plVar14;
      local_d0 = (long *)*puVar15;
    }
    local_c8 = puVar15[1];
    *puVar15 = plVar14;
    puVar15[1] = 0;
    *(undefined1 *)plVar14 = 0;
    plVar14 = (long *)std::__cxx11::string::append((char *)&local_d0);
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    puVar17 = (ulong *)(plVar14 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar14 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar17) {
      local_f0.field_2._M_allocated_capacity = *puVar17;
      local_f0.field_2._8_8_ = plVar14[3];
    }
    else {
      local_f0.field_2._M_allocated_capacity = *puVar17;
      local_f0._M_dataplus._M_p = (pointer)*plVar14;
    }
    local_f0._M_string_length = plVar14[1];
    *plVar14 = (long)puVar17;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    if (local_d0 != &local_c0) {
      operator_delete(local_d0,local_c0 + 1);
    }
    if (local_90 != local_80) {
      operator_delete(local_90,local_80[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_f0);
  }
  else {
    if ((((ConvolutionLayerParams *)puVar13)->kernelsize_).current_size_ == 2) goto LAB_0034511f;
    std::operator+(&local_70,"Offset parameter for the crop layer \'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
    plVar14 = (long *)std::__cxx11::string::append((char *)&local_70);
    paVar1 = &local_b0.field_2;
    puVar17 = (ulong *)(plVar14 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar14 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar17) {
      local_b0.field_2._M_allocated_capacity = *puVar17;
      local_b0.field_2._8_8_ = plVar14[3];
      local_b0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_b0.field_2._M_allocated_capacity = *puVar17;
      local_b0._M_dataplus._M_p = (pointer)*plVar14;
    }
    local_b0._M_string_length = plVar14[1];
    *plVar14 = (long)puVar17;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    if (layer->_oneof_case_[0] == 0xbe) {
      puVar13 = *(undefined1 **)&layer->layer_;
    }
    else {
      puVar13 = Specification::_CropLayerParams_default_instance_;
    }
    uVar4 = (((ConvolutionLayerParams *)puVar13)->kernelsize_).current_size_;
    uVar7 = -uVar4;
    if (0 < (int)uVar4) {
      uVar7 = uVar4;
    }
    uVar20 = 1;
    if (9 < uVar7) {
      uVar18 = (ulong)uVar7;
      uVar8 = 4;
      do {
        uVar20 = uVar8;
        uVar16 = (uint)uVar18;
        if (uVar16 < 100) {
          uVar20 = uVar20 - 2;
          goto LAB_003454a5;
        }
        if (uVar16 < 1000) {
          uVar20 = uVar20 - 1;
          goto LAB_003454a5;
        }
        if (uVar16 < 10000) goto LAB_003454a5;
        uVar18 = uVar18 / 10000;
        uVar8 = uVar20 + 4;
      } while (99999 < uVar16);
      uVar20 = uVar20 + 1;
    }
LAB_003454a5:
    local_90 = local_80;
    std::__cxx11::string::_M_construct((ulong)&local_90,(char)uVar20 - (char)((int)uVar4 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((ulong)(uVar4 >> 0x1f) + (long)local_90),uVar20,uVar7);
    uVar19 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar1) {
      uVar19 = local_b0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar19 < local_88 + local_b0._M_string_length) {
      uVar18 = 0xf;
      if (local_90 != local_80) {
        uVar18 = local_80[0];
      }
      if (uVar18 < local_88 + local_b0._M_string_length) goto LAB_00345517;
      puVar15 = (undefined8 *)
                std::__cxx11::string::replace
                          ((ulong)&local_90,0,(char *)0x0,(ulong)local_b0._M_dataplus._M_p);
    }
    else {
LAB_00345517:
      puVar15 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_90);
    }
    local_d0 = &local_c0;
    plVar14 = puVar15 + 2;
    if ((long *)*puVar15 == plVar14) {
      local_c0 = *plVar14;
      uStack_b8 = puVar15[3];
    }
    else {
      local_c0 = *plVar14;
      local_d0 = (long *)*puVar15;
    }
    local_c8 = puVar15[1];
    *puVar15 = plVar14;
    puVar15[1] = 0;
    *(undefined1 *)plVar14 = 0;
    puVar15 = (undefined8 *)std::__cxx11::string::append((char *)&local_d0);
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    puVar17 = puVar15 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar15 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar17) {
      local_f0.field_2._M_allocated_capacity = *puVar17;
      local_f0.field_2._8_8_ = puVar15[3];
    }
    else {
      local_f0.field_2._M_allocated_capacity = *puVar17;
      local_f0._M_dataplus._M_p = (pointer)*puVar15;
    }
    local_f0._M_string_length = puVar15[1];
    *puVar15 = puVar17;
    puVar15[1] = 0;
    *(undefined1 *)(puVar15 + 2) = 0;
    if (local_d0 != &local_c0) {
      operator_delete(local_d0,local_c0 + 1);
    }
    if (local_90 != local_80) {
      operator_delete(local_90,local_80[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_f0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p == &local_f0.field_2) {
    return __return_storage_ptr__;
  }
LAB_00345655:
  operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateCropLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 2));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, 1));

    if (ndArrayInterpretation) {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputOutputRankEquality(layer, "Crop", blobNameToRank));
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateRankCount(layer, "Crop", 3, -1, blobNameToRank));

        if (layer.input_size() > 1) {
            if (blobNameToRank.find(layer.input(0)) != blobNameToRank.end() &&
                blobNameToRank.find(layer.input(1)) != blobNameToRank.end()) {
                if (blobNameToRank.at(layer.input(0)) != blobNameToRank.at(layer.input(1))) {
                    std::string err;
                    err = "Layer '" + std::string(layer.name()) + "' of type 'Crop' expects equal ranks for its inputs, but they are not equal.";
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                }
            }
        }
    }

    if (layer.input_size() == 1) {
        // check the border amounts
        if (layer.crop().cropamounts().borderamounts_size() != 2) {
            std::string err = "cropAmounts parameter for the crop layer '" + layer.name() + "' is of length " + std::to_string(layer.crop().cropamounts().borderamounts_size()) + " but requires exactly two crop constraints (for X,Y axes).";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }
    else { // size == 2 checked above
        // offset must be size 2
        if (layer.crop().offset_size() != 2)  {
            std::string err = "Offset parameter for the crop layer '" + layer.name() + "' is of length " + std::to_string(layer.crop().offset_size()) + " but requires exactly two offsets (for X,Y axes).";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }

    return Result();
}